

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O2

ostream * perf::operator<<(ostream *o,timer *timer)

{
  ostream *poVar1;
  duration *time;
  ostringstream strm;
  string sStack_1b8;
  long local_198;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  format_code_position
            (&sStack_1b8,(string *)(timer + 1),timer[2].m_start.__d.__r,(string *)(timer + 3));
  std::operator<<((ostream *)local_190,(string *)&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  if ((ulong)timer[2].m_start.__d.__r < (ulong)timer[2].m_stop.__d.__r) {
    poVar1 = std::operator<<((ostream *)local_190,"-");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  poVar1 = std::operator<<((ostream *)local_190,": ");
  local_198 = (timer->m_stop).__d.__r - (timer->m_start).__d.__r;
  format_duration_abi_cxx11_(&sStack_1b8,(perf *)&local_198,time);
  std::operator<<(poVar1,(string *)&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::stringbuf::str();
  std::operator<<(o,(string *)&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return o;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const inline_timer &timer)
    {
        std::ostringstream strm;
        strm << format_code_position(timer.m_file, timer.m_first_line, timer.m_function);
        if (timer.m_last_line > timer.m_first_line)
            strm << "-" << timer.m_last_line;
        strm << ": " << format_duration(timer.get_duration());
        o << strm.str();
        return o;
    }